

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::internal::window
               (cvui_block_t *theBlock,int theX,int theY,int theWidth,int theHeight,String *theTitle
               )

{
  Size_<int> local_58;
  Size_<int> local_50;
  Size aSize;
  Rect aContent;
  Rect aTitleBar;
  String *theTitle_local;
  int theHeight_local;
  int theWidth_local;
  int theY_local;
  int theX_local;
  cvui_block_t *theBlock_local;
  
  cv::Rect_<int>::Rect_((Rect_<int> *)&aContent.width,theX,theY,theWidth,0x14);
  cv::Rect_<int>::Rect_
            ((Rect_<int> *)&aSize,theX,theY + aTitleBar.y,theWidth,theHeight - aTitleBar.y);
  render::window(theBlock,(Rect *)&aContent.width,(Rect *)&aSize,theTitle);
  cv::Size_<int>::Size_(&local_50,theWidth,theHeight);
  cv::Size_<int>::Size_(&local_58,&local_50);
  updateLayoutFlow(theBlock,&local_58);
  return;
}

Assistant:

void window(cvui_block_t& theBlock, int theX, int theY, int theWidth, int theHeight, const cv::String& theTitle) {
		cv::Rect aTitleBar(theX, theY, theWidth, 20);
		cv::Rect aContent(theX, theY + aTitleBar.height, theWidth, theHeight - aTitleBar.height);

		render::window(theBlock, aTitleBar, aContent, theTitle);

		// Update the layout flow
		cv::Size aSize(theWidth, theHeight);
		updateLayoutFlow(theBlock, aSize);
	}